

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O3

void __thiscall
icu_63::CollationFastLatinBuilder::addContractionEntry
          (CollationFastLatinBuilder *this,int32_t x,int64_t cce0,int64_t cce1,UErrorCode *errorCode
          )

{
  UVector64 *this_00;
  UBool UVar1;
  int iVar2;
  
  this_00 = &this->contractionCEs;
  iVar2 = (this->contractionCEs).count;
  if ((iVar2 < -1) || ((this->contractionCEs).capacity <= iVar2)) {
    UVar1 = UVector64::expandCapacity(this_00,iVar2 + 1,errorCode);
    iVar2 = (this->contractionCEs).count;
    if (UVar1 != '\0') goto LAB_0022f5b0;
  }
  else {
LAB_0022f5b0:
    (this->contractionCEs).elements[iVar2] = (long)x;
    iVar2 = iVar2 + 1;
    (this->contractionCEs).count = iVar2;
  }
  if ((iVar2 < -1) || ((this->contractionCEs).capacity <= iVar2)) {
    UVar1 = UVector64::expandCapacity(this_00,iVar2 + 1,errorCode);
    iVar2 = (this->contractionCEs).count;
    if (UVar1 != '\0') goto LAB_0022f5f0;
  }
  else {
LAB_0022f5f0:
    (this->contractionCEs).elements[iVar2] = cce0;
    iVar2 = iVar2 + 1;
    (this->contractionCEs).count = iVar2;
  }
  if ((iVar2 < -1) || ((this->contractionCEs).capacity <= iVar2)) {
    UVar1 = UVector64::expandCapacity(this_00,iVar2 + 1,errorCode);
    if (UVar1 == '\0') goto LAB_0022f644;
    iVar2 = (this->contractionCEs).count;
  }
  (this->contractionCEs).elements[iVar2] = cce1;
  (this->contractionCEs).count = iVar2 + 1;
LAB_0022f644:
  addUniqueCE(this,cce0,errorCode);
  addUniqueCE(this,cce1,errorCode);
  return;
}

Assistant:

void
CollationFastLatinBuilder::addContractionEntry(int32_t x, int64_t cce0, int64_t cce1,
                                               UErrorCode &errorCode) {
    contractionCEs.addElement(x, errorCode);
    contractionCEs.addElement(cce0, errorCode);
    contractionCEs.addElement(cce1, errorCode);
    addUniqueCE(cce0, errorCode);
    addUniqueCE(cce1, errorCode);
}